

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorList.c
# Opt level: O0

int CheckForCloseCubes(Cube *p,int fAddCube)

{
  int iVar1;
  Cube *p_00;
  int local_20;
  int i;
  int fAddCube_local;
  Cube *p_local;
  
  NewRangeReset();
  s_q = s_List;
  do {
    if (s_q == (Cube *)0x0) {
      if (fAddCube != 0) {
        CubeInsert(p);
      }
      NewRangeAdd();
      return 0;
    }
    s_Distance = GetDistancePlus(p,s_q);
    if (s_Distance < 5) {
      if (s_Distance == 4) {
        if (s_fDistEnable4 != 0) {
          NewRangeInsertCubePair(DIST4,p,s_q);
        }
      }
      else if (s_Distance == 3) {
        if (s_fDistEnable3 != 0) {
          NewRangeInsertCubePair(DIST3,p,s_q);
        }
      }
      else {
        if (s_Distance != 2) {
          if (s_Distance == 1) {
            s_ChangeStore.fInput = (int)(s_DiffVarNum != -1);
            s_ChangeStore.PrevQa = (int)s_q->a;
            s_ChangeStore.PrevPa = (int)p->a;
            s_ChangeStore.PrevQq = (int)s_q->q;
            s_ChangeStore.PrevPq = (int)p->q;
            s_ChangeStore.PrevPz = (int)p->z;
            s_ChangeStore.Var = s_DiffVarNum;
            s_ChangeStore.Value = s_DiffVarValueQ;
            s_ChangeStore.PrevID = (int)s_q->ID;
            s_ChangeStore.p = p;
            CubeExtract(s_q);
            if (s_DiffVarNum == -1) {
              p->z = 0;
              for (local_20 = 0; local_20 < g_CoverInfo.nWordsOut; local_20 = local_20 + 1) {
                p->pCubeDataOut[local_20] = s_q->pCubeDataOut[local_20] ^ p->pCubeDataOut[local_20];
                p->z = p->z + (ushort)BitCount[p->pCubeDataOut[local_20] & 0xffff] +
                              (ushort)BitCount[p->pCubeDataOut[local_20] >> 0x10];
              }
            }
            else {
              if ((s_DiffVarValueP_old == 1) || (s_DiffVarValueP_old == 2)) {
                p->a = p->a + -1;
              }
              if ((s_DiffVarValueP_new == 1) || (s_DiffVarValueP_new == 2)) {
                p->a = p->a + 1;
              }
              iVar1 = ComputeQCostBits(p);
              p->q = (short)iVar1;
            }
            AddToFreeCubes(s_q);
            iVar1 = CheckForCloseCubes(p,1);
            return iVar1 + 1;
          }
          AddToFreeCubes(p);
          p_00 = CubeExtract(s_q);
          AddToFreeCubes(p_00);
          NewRangeReset();
          return 2;
        }
        if (s_fDistEnable2 != 0) {
          NewRangeInsertCubePair(DIST2,p,s_q);
        }
      }
    }
    s_q = s_q->Next;
  } while( true );
}

Assistant:

int CheckForCloseCubes( Cube* p, int fAddCube )
// checks the cube storage for a cube that is dist-0 and dist-1 removed 
// from the given one (p) if such a cube is found, extracts it from the data 
// structure, EXORs it with the given cube, adds the resultant cube
// to the data structure and performed the same check for the resultant cube;
// returns the number of cubes gained in the process of reduction;
// if an adjacent cube is not found, inserts the cube only if (fAddCube==1)!!!
{
    // start the new range
    NewRangeReset();

    for ( s_q = s_List; s_q; s_q = s_q->Next )
    {
        s_Distance = GetDistancePlus( p, s_q );
        if ( s_Distance > 4 )
        {
        }
        else if ( s_Distance == 4 )
        {
            if ( s_fDistEnable4 ) 
                NewRangeInsertCubePair( DIST4, p, s_q );
        }
        else if ( s_Distance == 3 )
        {
            if ( s_fDistEnable3 ) 
                NewRangeInsertCubePair( DIST3, p, s_q );
        }
        else if ( s_Distance == 2 )
        { 
            if ( s_fDistEnable2 ) 
                NewRangeInsertCubePair( DIST2, p, s_q );
        }
        else if ( s_Distance == 1 )
        {   // extract the cube from the data structure

            //////////////////////////////////////////////////////////
            // store the changes
            s_ChangeStore.fInput = (s_DiffVarNum != -1);
            s_ChangeStore.p      = p;
            s_ChangeStore.PrevQa = s_q->a;
            s_ChangeStore.PrevPa = p->a;
            s_ChangeStore.PrevQq = s_q->q;
            s_ChangeStore.PrevPq = p->q;
            s_ChangeStore.PrevPz = p->z;
            s_ChangeStore.Var    = s_DiffVarNum;
            s_ChangeStore.Value  = s_DiffVarValueQ;
            s_ChangeStore.PrevID = s_q->ID;
            //////////////////////////////////////////////////////////

            CubeExtract( s_q );
            // perform the EXOR of the two cubes and write the result into p

            // it is important that the resultant cube is written into p!!!

            if ( s_DiffVarNum == -1 )
            {
                int i;
                // exor the output part
                p->z = 0;
                for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                {
                    p->pCubeDataOut[i] ^= s_q->pCubeDataOut[i];
                    p->z += BIT_COUNT(p->pCubeDataOut[i]);
                }
            }
            else
            {
                // the cube has already been updated by GetDistancePlus()

                // modify the parameters of the number of literals in the new cube
//              p->a += s_UpdateLiterals[ s_DiffVarValueP ][ s_DiffVarValueQ ];
                if ( s_DiffVarValueP_old == VAR_NEG || s_DiffVarValueP_old == VAR_POS )
                    p->a--;
                if ( s_DiffVarValueP_new == VAR_NEG || s_DiffVarValueP_new == VAR_POS )
                    p->a++;
                p->q = ComputeQCostBits(p);
            }

            // move q to the free cube list
            AddToFreeCubes( s_q );

            // make sure that nobody with use the pairs created so far
//          NewRangeReset();
            // call the function again for the new cube
            return 1 + CheckForCloseCubes( p, 1 );
        }
        else // if ( Distance == 0 )
        {   // extract the second cube from the data structure and add them both to the free list
            AddToFreeCubes( p );
            AddToFreeCubes( CubeExtract( s_q ) );

            // make sure that nobody with use the pairs created so far
            NewRangeReset();
            return 2;
        }
    }
    
    // add the cube to the data structure if needed
    if ( fAddCube )
        CubeInsert( p );

    // add temporarily stored new range of cube pairs to the queque
    NewRangeAdd();

    return 0;
}